

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::UnregisterExpirableObject(ThreadContext *this,ExpirableObject *object)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  ExpirableObject **element;
  
  if (this->expirableObjectList == (ExpirableObjectList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xbec,"(this->expirableObjectList)","this->expirableObjectList");
    if (!bVar2) goto LAB_007be5a3;
    *puVar3 = 0;
  }
  pvVar4 = ExpirableObject::GetRegistrationHandle(object);
  if (pvVar4 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xbed,"(object->GetRegistrationHandle() != nullptr)",
                       "object->GetRegistrationHandle() != nullptr");
    if (!bVar2) goto LAB_007be5a3;
    *puVar3 = 0;
  }
  element = (ExpirableObject **)ExpirableObject::GetRegistrationHandle(object);
  if (*element != object) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xbf0,"(*registrationData == object)","*registrationData == object");
    if (!bVar2) {
LAB_007be5a3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DListBase<ExpirableObject_*,_RealCount>::MoveElementTo
            (&this->expirableObjectList->super_DListBase<ExpirableObject_*,_RealCount>,element,
             &this->expirableObjectDisposeList->super_DListBase<ExpirableObject_*,_RealCount>);
  ExpirableObject::ClearRegistrationHandle(object);
  if (DAT_015d346a == '\x01') {
    Output::Trace(ExpirableCollectPhase,L"Unregistered 0x%p\n",object);
  }
  this->numExpirableObjects = this->numExpirableObjects + -1;
  return;
}

Assistant:

void
ThreadContext::UnregisterExpirableObject(ExpirableObject* object)
{
    Assert(this->expirableObjectList);
    Assert(object->GetRegistrationHandle() != nullptr);

    ExpirableObject** registrationData = (ExpirableObject**)PointerValue(object->GetRegistrationHandle());
    Assert(*registrationData == object);

    this->expirableObjectList->MoveElementTo(registrationData, this->expirableObjectDisposeList);
    object->ClearRegistrationHandle();
    OUTPUT_VERBOSE_TRACE(Js::ExpirableCollectPhase, _u("Unregistered 0x%p\n"), object);
    numExpirableObjects--;
}